

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGccDepfileLexerHelper.cxx
# Opt level: O2

void __thiscall cmGccDepfileLexerHelper::newEntry(cmGccDepfileLexerHelper *this)

{
  pointer pcVar1;
  pointer pbVar2;
  
  if ((this->HelperState == Rule) &&
     (pcVar1 = (this->Content).
               super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
               _M_impl.super__Vector_impl_data._M_finish,
     (this->Content).super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
     ._M_impl.super__Vector_impl_data._M_start != pcVar1)) {
    pbVar2 = pcVar1[-1].rules.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((pcVar1[-1].rules.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start != pbVar2) && (pbVar2[-1]._M_string_length != 0))
    {
      this->HelperState = Failed;
    }
    return;
  }
  this->HelperState = Rule;
  std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::emplace_back<>
            (&this->Content);
  newRule(this);
  return;
}

Assistant:

void cmGccDepfileLexerHelper::newEntry()
{
  if (this->HelperState == State::Rule && !this->Content.empty()) {
    if (!this->Content.back().rules.empty() &&
        !this->Content.back().rules.back().empty()) {
      this->HelperState = State::Failed;
    }
    return;
  }
  this->HelperState = State::Rule;
  this->Content.emplace_back();
  this->newRule();
}